

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

ssize_t __thiscall
duckdb_parquet::EncryptionAlgorithm::read
          (EncryptionAlgorithm *this,int __fd,void *__buf,size_t __nbytes)

{
  uint32_t uVar1;
  uint uVar2;
  ssize_t sVar3;
  short *__nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  int16_t fid;
  TType ftype;
  string fname;
  uint32_t xfer;
  TInputRecursionTracker tracker;
  undefined4 in_stack_ffffffffffffff68;
  TType in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint32_t in_stack_ffffffffffffff78;
  uint32_t in_stack_ffffffffffffff7c;
  uint32_t in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  short local_46;
  int local_44;
  string local_40 [36];
  uint local_1c;
  undefined8 local_10;
  EncryptionAlgorithm *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  duckdb_apache::thrift::protocol::TInputRecursionTracker::TInputRecursionTracker
            ((TInputRecursionTracker *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
             ,(TProtocol *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  local_1c = 0;
  std::__cxx11::string::string(local_40);
  uVar1 = duckdb_apache::thrift::protocol::TProtocol::readStructBegin
                    ((TProtocol *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     (string *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  local_1c = uVar1 + local_1c;
  while( true ) {
    __nbytes_00 = &local_46;
    uVar1 = duckdb_apache::thrift::protocol::TProtocol::readFieldBegin
                      ((TProtocol *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       (string *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                       (TType *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       (int16_t *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    local_1c = uVar1 + local_1c;
    if (local_44 == 0) break;
    if (local_46 == 1) {
      if (local_44 == 0xc) {
        sVar3 = AesGcmV1::read(&this->AES_GCM_V1,(int)local_10,__buf_00,(size_t)__nbytes_00);
        local_1c = (int)sVar3 + local_1c;
        this->__isset = (_EncryptionAlgorithm__isset)((byte)this->__isset & 0xfe | 1);
      }
      else {
        uVar1 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                           in_stack_ffffffffffffff6c);
        local_1c = uVar1 + local_1c;
      }
    }
    else if (local_46 == 2) {
      if (local_44 == 0xc) {
        sVar3 = AesGcmCtrV1::read(&this->AES_GCM_CTR_V1,(int)local_10,__buf_00,(size_t)__nbytes_00);
        in_stack_ffffffffffffff84 = (int)sVar3;
        local_1c = in_stack_ffffffffffffff84 + local_1c;
        this->__isset = (_EncryptionAlgorithm__isset)((byte)this->__isset & 0xfd | 2);
      }
      else {
        in_stack_ffffffffffffff80 =
             duckdb_apache::thrift::protocol::TProtocol::skip
                       ((TProtocol *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        in_stack_ffffffffffffff6c);
        local_1c = in_stack_ffffffffffffff80 + local_1c;
      }
    }
    else {
      in_stack_ffffffffffffff7c =
           duckdb_apache::thrift::protocol::TProtocol::skip
                     ((TProtocol *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      in_stack_ffffffffffffff6c);
      local_1c = in_stack_ffffffffffffff7c + local_1c;
    }
    in_stack_ffffffffffffff78 =
         duckdb_apache::thrift::protocol::TProtocol::readFieldEnd((TProtocol *)0x71d575);
    local_1c = in_stack_ffffffffffffff78 + local_1c;
  }
  uVar1 = duckdb_apache::thrift::protocol::TProtocol::readStructEnd((TProtocol *)0x71d599);
  uVar2 = uVar1 + local_1c;
  local_1c = uVar2;
  std::__cxx11::string::~string(local_40);
  duckdb_apache::thrift::protocol::TInputRecursionTracker::~TInputRecursionTracker
            ((TInputRecursionTracker *)0x71d5ca);
  return (ulong)uVar2;
}

Assistant:

uint32_t EncryptionAlgorithm::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;


  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->AES_GCM_V1.read(iprot);
          this->__isset.AES_GCM_V1 = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->AES_GCM_CTR_V1.read(iprot);
          this->__isset.AES_GCM_CTR_V1 = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  return xfer;
}